

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorPool::CrossLinkOnDemandHelper
          (DescriptorPool *this,string_view name,bool expecting_enum)

{
  Symbol SVar1;
  undefined7 in_register_00000009;
  string_view name_00;
  string lookup_name;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,name._M_str,name._M_str + name._M_len,
             CONCAT71(in_register_00000009,expecting_enum));
  if ((local_50 != 0) && ((char)*local_58 == '.')) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)&local_58);
    std::__cxx11::string::operator=((string *)&local_58,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  name_00._M_str = (char *)local_58;
  name_00._M_len = local_50;
  SVar1 = Tables::FindByNameHelper
                    ((this->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                     _M_head_impl,this,name_00);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return (Symbol)SVar1.ptr_;
}

Assistant:

Symbol DescriptorPool::CrossLinkOnDemandHelper(absl::string_view name,
                                               bool expecting_enum) const {
  (void)expecting_enum;  // Parameter is used by Google-internal code.
  auto lookup_name = std::string(name);
  if (!lookup_name.empty() && lookup_name[0] == '.') {
    lookup_name = lookup_name.substr(1);
  }
  Symbol result = tables_->FindByNameHelper(this, lookup_name);
  return result;
}